

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse(parser_t<comments_skipper_t> *this)

{
  istream *piVar1;
  type_t local_10 [2];
  
  local_10[0] = start_document;
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::emplace_back<sax_event_t::type_t>
            ((vector<sax_event_t,_std::allocator<sax_event_t>_> *)this->handler,local_10);
  while( true ) {
    parse_expression(this);
    piVar1 = (this->input).m_backend;
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 2) != 0) break;
    parse_new_line(this);
  }
  local_10[1] = 2;
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::emplace_back<sax_event_t::type_t>
            ((vector<sax_event_t,_std::allocator<sax_event_t>_> *)this->handler,local_10 + 1);
  return;
}

Assistant:

void parse() {
        handler.start_document();

        parse_expression();

        while (!input.eof()) {
            parse_new_line();
            parse_expression();
        }

        handler.finish_document();
    }